

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finddefault.c
# Opt level: O2

PmDeviceID find_default_device(char *path,int input,PmDeviceID id)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  char *__dest;
  char *pcVar5;
  FILE *__stream;
  long lVar6;
  char *__s;
  char pref_str [256];
  
  pcVar2 = getenv("HOME");
  if (pcVar2 != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    sVar4 = strlen(path);
    __dest = (char *)malloc(sVar3 + sVar4 + 0x1d);
    strcpy(__dest,pcVar2);
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,"/.java/.userPrefs/",0x13);
    __s = path + (*path == '/');
    pcVar5 = strrchr(__s,0x2f);
    pcVar2 = __s;
    if (pcVar5 != (char *)0x0) {
      pcVar2 = pcVar5 + 1;
      sVar3 = strlen(__dest);
      memcpy(__dest + (int)sVar3,__s,(long)pcVar2 - (long)__s);
      __dest[(long)(pcVar5 + (((long)(int)sVar3 + 1) - (long)__s))] = '\0';
    }
    sVar3 = strlen(__dest);
    builtin_strncpy(__dest + sVar3,"prefs.xml",10);
    __stream = fopen(__dest,"r");
    if (__stream != (FILE *)0x0) {
      while (iVar1 = getc(__stream), iVar1 != -1) {
        if (((iVar1 == 0x22) && (iVar1 = match_string((FILE *)__stream,pcVar2), iVar1 != 0)) &&
           (iVar1 = getc(__stream), iVar1 == 0x22)) {
          iVar1 = match_string((FILE *)__stream,"value");
          if (iVar1 == 0) {
            return id;
          }
          iVar1 = match_string((FILE *)__stream,"=");
          if (iVar1 == 0) {
            return id;
          }
          iVar1 = match_string((FILE *)__stream,"\"");
          if (iVar1 == 0) {
            return id;
          }
          for (lVar6 = 0; lVar6 != 0x100; lVar6 = lVar6 + 1) {
            iVar1 = getc(__stream);
            if (iVar1 == 0x22) {
              pref_str[lVar6] = '\0';
              iVar1 = pm_find_default_device(pref_str,input);
              if (iVar1 == -1) {
                return id;
              }
              return iVar1;
            }
            pref_str[lVar6] = (char)iVar1;
          }
        }
      }
    }
  }
  return id;
}

Assistant:

PmDeviceID find_default_device(char *path, int input, PmDeviceID id)
/* path -- the name of the preference we are searching for
   input -- true iff this is an input device
   id -- current default device id
   returns matching device id if found, otherwise id
*/
{
    static char *pref_2 = "/.java/.userPrefs/";
    static char *pref_3 = "prefs.xml";
    char *pref_1 = getenv("HOME");
    char *full_name, *path_ptr;
    FILE *inf;
    int c, i;
    if (!pref_1) goto nopref; // cannot find preference file
    // full_name will be larger than necessary
    full_name  = malloc(strlen(pref_1) + strlen(pref_2) + strlen(pref_3) +
                        strlen(path) + 2);
    strcpy(full_name, pref_1); 
    strcat(full_name, pref_2);
    // copy all but last path segment to full_name
    if (*path == '/') path++; // skip initial slash in path
    path_ptr = strrchr(path, '/'); 
    if (path_ptr) { // copy up to slash after full_name
        path_ptr++;
        int offset = strlen(full_name);
        memcpy(full_name + offset, path, path_ptr - path);
        full_name[offset + path_ptr - path] = 0; // end of string
    } else {
        path_ptr = path;
    }
    strcat(full_name, pref_3);
    inf = fopen(full_name, "r");
    if (!inf) goto nopref; // cannot open preference file
    // We're not going to build or link in a full XML parser.
    // Instead, find the path string and quoute. Then, look for
    // "value", "=", quote. Then get string up to quote.
    while ((c = getc(inf)) != EOF) {
        char pref_str[STRING_MAX];
        if (c != '"') continue; // scan up to quote
        // look for quote string quote
        if (!match_string(inf, path_ptr)) continue; // path not found
        if (getc(inf) != '"') continue; // path not found, keep scanning
        if (!match_string(inf, "value")) goto nopref; // value not found
        if (!match_string(inf, "=")) goto nopref; // = not found
        if (!match_string(inf, "\"")) goto nopref; // quote not found
        // now read the value up to the close quote
        for (i = 0; i < STRING_MAX; i++) {
            if ((c = getc(inf)) == '"') break;
            pref_str[i] = c;
        }
        if (i == STRING_MAX) continue; // value too long, ignore
        pref_str[i] = 0;
        i = pm_find_default_device(pref_str, input);
        if (i != pmNoDevice) {
            id = i;
	}
        break;
    }
 nopref:
    return id;
}